

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void xchg_ecx(PDISASM pMyDisasm)

{
  OPTYPE *__dest;
  int iVar1;
  Int32 IVar2;
  char (*__src) [8];
  
  (pMyDisasm->Instruction).Category = 0x10001;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"xchg",5);
  __dest = &pMyDisasm->Operand1;
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  (pMyDisasm->Operand1).Registers.gpr = 1;
  (pMyDisasm->Operand2).OpType = 0x20000;
  (pMyDisasm->Operand2).Registers.type = 1;
  (pMyDisasm->Operand2).Registers.gpr = 2;
  iVar1 = (pMyDisasm->Reserved_).OperandSize;
  if (iVar1 == 0x20) {
    strcpy(__dest->OpMnemonic,Registers32Bits[0]);
    __src = Registers32Bits + (ulong)((pMyDisasm->Reserved_).REX.B_ == '\x01') * 8 + 1;
    IVar2 = 0x20;
  }
  else if (iVar1 == 0x40) {
    strcpy(__dest->OpMnemonic,Registers64Bits[0]);
    __src = (char (*) [8])
            (Registers64Bits + (ulong)((pMyDisasm->Reserved_).REX.B_ == '\x01') * 8 + 1);
    IVar2 = 0x40;
  }
  else {
    strcpy(__dest->OpMnemonic,Registers16Bits[0]);
    __src = Registers16Bits + (ulong)((pMyDisasm->Reserved_).REX.B_ == '\x01') * 8 + 1;
    IVar2 = 0x10;
  }
  strcpy((pMyDisasm->Operand2).OpMnemonic,*__src);
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  (pMyDisasm->Operand2).AccessMode = 2;
  (pMyDisasm->Operand1).OpSize = IVar2;
  (pMyDisasm->Operand2).OpSize = IVar2;
  return;
}

Assistant:

void __bea_callspec__ xchg_ecx(PDISASM pMyDisasm)
{
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xchg");
    #endif
    pMyDisasm->Operand1.OpType = REGISTER_TYPE;
  pMyDisasm->Operand1.Registers.type = GENERAL_REG;
  pMyDisasm->Operand1.Registers.gpr = REG0;
    pMyDisasm->Operand2.OpType = REGISTER_TYPE;
  pMyDisasm->Operand2.Registers.type = GENERAL_REG;
  pMyDisasm->Operand2.Registers.gpr = REG1;
    if (GV.OperandSize == 64) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0]);
        #endif
        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers64Bits[1+8]);
            #endif
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers64Bits[1]);
            #endif
        }
        GV.EIP_++;
        pMyDisasm->Operand2.AccessMode = WRITE;
        pMyDisasm->Operand1.OpSize = 64;
        pMyDisasm->Operand2.OpSize = 64;
    }
    else if (GV.OperandSize == 32) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0]);
        #endif
        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers32Bits[1+8]);
            #endif
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers32Bits[1]);
            #endif
        }
        GV.EIP_++;
        pMyDisasm->Operand2.AccessMode = WRITE;
        pMyDisasm->Operand1.OpSize = 32;
        pMyDisasm->Operand2.OpSize = 32;
    }
    else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0]);
        #endif
        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers16Bits[1+8]);
            #endif
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers16Bits[1]);
            #endif
        }
        GV.EIP_++;
        pMyDisasm->Operand2.AccessMode = WRITE;
        pMyDisasm->Operand1.OpSize = 16;
        pMyDisasm->Operand2.OpSize = 16;
    }
}